

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::TextureFilterMinmaxFilteringTestCaseBase::iterate
          (TextureFilterMinmaxFilteringTestCaseBase *this)

{
  uint uVar1;
  SupportedTextureDataTypeIter SVar2;
  bool bVar3;
  int iVar4;
  GLenum GVar5;
  deUint32 err;
  GLuint GVar6;
  deBool dVar7;
  RenderContext *context;
  undefined4 extraout_var;
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
  *pvVar8;
  reference ppSVar9;
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
  *pvVar10;
  pointer pSVar11;
  vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
  *pvVar12;
  pointer pRVar13;
  mapped_type *pmVar14;
  TestError *pTVar15;
  key_type_conflict local_d0 [4];
  Vector<int,_2> local_c0;
  Vector<int,_2> local_b8;
  GLuint local_b0;
  GLuint resultTextureId;
  Vector<int,_2> local_a0;
  IVec2 scaledTextureSize;
  __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::ReductionModeParam_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>_>
  local_80;
  ReductionModeParamIter paramIter;
  map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  reductionModeTexelSumMap;
  __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
  local_40;
  SupportedTextureDataTypeIter dataTypeIter;
  SupportedTextureType *textureType;
  __normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*const_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
  local_28;
  SupportedTextureTypeIter textureTypeIter;
  Functions *gl;
  RenderContext *renderContext;
  TextureFilterMinmaxFilteringTestCaseBase *this_local;
  
  context = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*context->_vptr_RenderContext[3])();
  textureTypeIter._M_current = (SupportedTextureType **)CONCAT44(extraout_var,iVar4);
  pvVar8 = TextureFilterMinmaxUtils::getSupportedTextureTypes(&this->m_utils);
  local_28._M_current =
       (SupportedTextureType **)
       std::
       vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
       ::begin(pvVar8);
  do {
    pvVar8 = TextureFilterMinmaxUtils::getSupportedTextureTypes(&this->m_utils);
    textureType = (SupportedTextureType *)
                  std::
                  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
                  ::end(pvVar8);
    bVar3 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*const_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
                        *)&textureType);
    if (!bVar3) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    ppSVar9 = __gnu_cxx::
              __normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*const_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
              ::operator*(&local_28);
    dataTypeIter._M_current = (SupportedTextureDataType *)*ppSVar9;
    pvVar10 = TextureFilterMinmaxUtils::getSupportedTextureDataTypes(&this->m_utils);
    local_40._M_current =
         (SupportedTextureDataType *)
         std::
         vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
         ::begin(pvVar10);
    while( true ) {
      pvVar10 = TextureFilterMinmaxUtils::getSupportedTextureDataTypes(&this->m_utils);
      reductionModeTexelSumMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)std::
                   vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
                   ::end(pvVar10);
      bVar3 = __gnu_cxx::operator!=
                        (&local_40,
                         (__normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
                          *)&reductionModeTexelSumMap._M_t._M_impl.super__Rb_tree_header.
                             _M_node_count);
      if (!bVar3) break;
      pSVar11 = __gnu_cxx::
                __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
                ::operator->(&local_40);
      bVar3 = TextureFilterMinmaxUtils::SupportedTextureDataType::hasFlag(pSVar11,MINMAX);
      if (bVar3) {
        pSVar11 = __gnu_cxx::
                  __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
                  ::operator->(&local_40);
        bVar3 = TextureFilterMinmaxUtils::SupportedTextureDataType::hasFlag(pSVar11,EXCLUDE_3D);
        if ((!bVar3) ||
           (GVar5 = TextureFilterMinmaxUtils::SupportedTextureType::getType
                              ((SupportedTextureType *)dataTypeIter._M_current), GVar5 != 0x806f)) {
          pSVar11 = __gnu_cxx::
                    __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
                    ::operator->(&local_40);
          bVar3 = TextureFilterMinmaxUtils::SupportedTextureDataType::hasFlag(pSVar11,EXCLUDE_CUBE);
          if ((!bVar3) ||
             (GVar5 = TextureFilterMinmaxUtils::SupportedTextureType::getType
                                ((SupportedTextureType *)dataTypeIter._M_current), GVar5 != 0x8513))
          {
            std::
            map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
            ::map((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   *)&paramIter);
            pvVar12 = TextureFilterMinmaxUtils::getReductionModeParams(&this->m_utils);
            local_80._M_current =
                 (ReductionModeParam *)
                 std::
                 vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
                 ::begin(pvVar12);
            while( true ) {
              pvVar12 = TextureFilterMinmaxUtils::getReductionModeParams(&this->m_utils);
              scaledTextureSize.m_data =
                   (int  [2])
                   std::
                   vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
                   ::end(pvVar12);
              bVar3 = __gnu_cxx::operator!=
                                (&local_80,
                                 (__normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::ReductionModeParam_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>_>
                                  *)&scaledTextureSize);
              if (!bVar3) break;
              pRVar13 = __gnu_cxx::
                        __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::ReductionModeParam_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>_>
                        ::operator->(&local_80);
              if ((pRVar13->m_queryTestOnly & 1U) == 0) {
                tcu::Vector<int,_2>::Vector(&local_a0,(int)(this->m_renderScale * 32.0));
                SVar2 = dataTypeIter;
                tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&stack0xffffffffffffff54,0x20);
                pSVar11 = __gnu_cxx::
                          __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
                          ::operator->(&local_40);
                GVar5 = pSVar11->m_format;
                pSVar11 = __gnu_cxx::
                          __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
                          ::operator->(&local_40);
                (**(code **)(*(long *)SVar2._M_current + 0x20))
                          (SVar2._M_current,context,&stack0xffffffffffffff54,GVar5,pSVar11->m_type,
                           this->m_mipmapping & 1);
                local_b0 = 0;
                (*(code *)textureTypeIter._M_current[0xdf])(1,&local_b0);
                err = (*(code *)textureTypeIter._M_current[0x100])();
                glu::checkError(err,"glGenTextures() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                                ,0x2b0);
                SVar2 = dataTypeIter;
                GVar6 = local_b0;
                tcu::Vector<int,_2>::Vector(&local_b8,&local_a0);
                pRVar13 = __gnu_cxx::
                          __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::ReductionModeParam_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>_>
                          ::operator->(&local_80);
                TextureFilterMinmaxUtils::SupportedTextureType::renderToFBO
                          ((SupportedTextureType *)SVar2._M_current,context,GVar6,&local_b8,
                           pRVar13->m_reductionMode);
                GVar6 = local_b0;
                tcu::Vector<int,_2>::Vector(&local_c0,&local_a0);
                GVar6 = TextureFilterMinmaxUtils::calcPixelSumValue
                                  (&this->m_utils,context,GVar6,&local_c0,0x1903,0x1401);
                pRVar13 = __gnu_cxx::
                          __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::ReductionModeParam_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>_>
                          ::operator->(&local_80);
                pmVar14 = std::
                          map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                          ::operator[]((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                                        *)&paramIter,&pRVar13->m_reductionMode);
                *pmVar14 = GVar6;
                (*(code *)textureTypeIter._M_current[0x90])(1,&local_b0);
              }
              __gnu_cxx::
              __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::ReductionModeParam_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>_>
              ::operator++(&local_80);
            }
            do {
              dVar7 = ::deGetFalse();
              bVar3 = false;
              if (dVar7 == 0) {
                local_d0[3] = 0x8007;
                pmVar14 = std::
                          map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                          ::operator[]((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                                        *)&paramIter,local_d0 + 3);
                uVar1 = *pmVar14;
                local_d0[2] = 0x9367;
                pmVar14 = std::
                          map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                          ::operator[]((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                                        *)&paramIter,local_d0 + 2);
                bVar3 = uVar1 < *pmVar14;
              }
              if (!bVar3) {
                pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar15,
                           "Sum of texels for GL_MIN should be smaller than for GL_WEIGHTED_AVERAGE_ARB"
                           ,
                           "reductionModeTexelSumMap[GL_MIN] < reductionModeTexelSumMap[GL_WEIGHTED_AVERAGE_ARB]"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                           ,699);
                __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
              }
              dVar7 = ::deGetFalse();
            } while (dVar7 != 0);
            do {
              dVar7 = ::deGetFalse();
              bVar3 = false;
              if (dVar7 == 0) {
                local_d0[1] = 0x8008;
                pmVar14 = std::
                          map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                          ::operator[]((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                                        *)&paramIter,local_d0 + 1);
                uVar1 = *pmVar14;
                local_d0[0] = 0x9367;
                pmVar14 = std::
                          map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                          ::operator[]((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                                        *)&paramIter,local_d0);
                bVar3 = *pmVar14 < uVar1;
              }
              if (!bVar3) {
                pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar15,
                           "Sum of texels for GL_MAX should be greater than for GL_WEIGHTED_AVERAGE_ARB"
                           ,
                           "reductionModeTexelSumMap[GL_MAX] > reductionModeTexelSumMap[GL_WEIGHTED_AVERAGE_ARB]"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                           ,0x2be);
                __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
              }
              dVar7 = ::deGetFalse();
            } while (dVar7 != 0);
            std::
            map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
            ::~map((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                    *)&paramIter);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
      ::operator++(&local_40);
    }
    __gnu_cxx::
    __normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*const_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TextureFilterMinmaxFilteringTestCaseBase::iterate()
{
	const glu::RenderContext& renderContext = m_context.getRenderContext();
	const glw::Functions&	 gl			= renderContext.getFunctions();

	for (TextureFilterMinmaxUtils::SupportedTextureTypeIter textureTypeIter =
			 m_utils.getSupportedTextureTypes().begin();
		 textureTypeIter != m_utils.getSupportedTextureTypes().end(); ++textureTypeIter)
	{
		TextureFilterMinmaxUtils::SupportedTextureType* textureType = *textureTypeIter;

		for (TextureFilterMinmaxUtils::SupportedTextureDataTypeIter dataTypeIter =
				 m_utils.getSupportedTextureDataTypes().begin();
			 dataTypeIter != m_utils.getSupportedTextureDataTypes().end(); ++dataTypeIter)
		{
			if (!dataTypeIter->hasFlag(TextureFilterMinmaxUtils::MINMAX))
				continue;

			if (dataTypeIter->hasFlag(TextureFilterMinmaxUtils::EXCLUDE_3D) && textureType->getType() == GL_TEXTURE_3D)
				continue;

			if (dataTypeIter->hasFlag(TextureFilterMinmaxUtils::EXCLUDE_CUBE) &&
				textureType->getType() == GL_TEXTURE_CUBE_MAP)
				continue;

			std::map<glw::GLint, glw::GLuint> reductionModeTexelSumMap;

			for (TextureFilterMinmaxUtils::ReductionModeParamIter paramIter = m_utils.getReductionModeParams().begin();
				 paramIter != m_utils.getReductionModeParams().end(); ++paramIter)
			{
				if (paramIter->m_queryTestOnly)
					continue;

				tcu::IVec2 scaledTextureSize(int(float(TEXTURE_FILTER_MINMAX_SIZE) * m_renderScale));

				textureType->generate(renderContext, tcu::IVec3(TEXTURE_FILTER_MINMAX_SIZE), dataTypeIter->m_format,
									  dataTypeIter->m_type, m_mipmapping);

				glw::GLuint resultTextureId = 0;
				gl.genTextures(1, &resultTextureId);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

				textureType->renderToFBO(renderContext, resultTextureId, scaledTextureSize, paramIter->m_reductionMode);

				reductionModeTexelSumMap[paramIter->m_reductionMode] = m_utils.calcPixelSumValue(
					renderContext, resultTextureId, scaledTextureSize, GL_RED, GL_UNSIGNED_BYTE);

				gl.deleteTextures(1, &resultTextureId);
			}

			TCU_CHECK_MSG(reductionModeTexelSumMap[GL_MIN] < reductionModeTexelSumMap[GL_WEIGHTED_AVERAGE_ARB],
						  "Sum of texels for GL_MIN should be smaller than for GL_WEIGHTED_AVERAGE_ARB");

			TCU_CHECK_MSG(reductionModeTexelSumMap[GL_MAX] > reductionModeTexelSumMap[GL_WEIGHTED_AVERAGE_ARB],
						  "Sum of texels for GL_MAX should be greater than for GL_WEIGHTED_AVERAGE_ARB");
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}